

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

Super_Man_t *
Super_Compute(Super_Man_t *pMan,Mio_Gate_t **ppGates,int nGates,int nGatesMax,int fSkipInv)

{
  float fVar1;
  int iVar2;
  int iVar3;
  ProgressBar *pPro;
  abctime aVar4;
  Super_Gate_t_conflict **ppG1;
  Super_Gate_t_conflict *pSVar5;
  uint uVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  int iPruneLimitRoot;
  int iPruneLimit;
  int fPrune;
  int fTimeOut;
  ProgressBar *pProgress;
  int local_168;
  int t;
  int s;
  int k;
  int nGatesLimit;
  int nFanins;
  Super_Gate_t_conflict **ppGatesLimit;
  int i5;
  int i4;
  int i3;
  int i2;
  int i1;
  int i0;
  uint uTruths [6] [2];
  uint uTruth [2];
  float AreaMio;
  float Area4;
  float Area3;
  float Area2;
  float Area1;
  float Area0;
  float Area;
  float tDelayMio;
  float tPinDelayMax;
  float *ptPinDelays [6];
  float tPinDelaysRes [6];
  Super_Gate_t_conflict *pGateNew;
  Super_Gate_t_conflict *pGate5;
  Super_Gate_t_conflict *pGate4;
  Super_Gate_t_conflict *pGate3;
  Super_Gate_t_conflict *pGate2;
  Super_Gate_t_conflict *pGate1;
  Super_Gate_t_conflict *pGate0;
  Super_Gate_t *pSupers [6];
  int fSkipInv_local;
  int nGatesMax_local;
  int nGates_local;
  Mio_Gate_t **ppGates_local;
  Super_Man_t *pMan_local;
  
  Area1 = 0.0;
  pSupers[5]._4_4_ = fSkipInv;
  Super_TranferGatesToArray(pMan);
  if (10000 < pMan->nGates) {
    printf("Sorting array of %d supergates...\r",(ulong)(uint)pMan->nGates);
    fflush(_stdout);
  }
  qsort(pMan->pGates,(long)pMan->nGates,8,Super_DelayCompare);
  iVar2 = Super_DelayCompare(pMan->pGates,pMan->pGates + (long)pMan->nGates + -1);
  if (0 < iVar2) {
    __assert_fail("Super_DelayCompare( pMan->pGates, pMan->pGates + pMan->nGates - 1 ) <= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                  ,0x175,"Super_Man_t *Super_Compute(Super_Man_t *, Mio_Gate_t **, int, int, int)");
  }
  if (10000 < pMan->nGates) {
    printf("                                       \r");
  }
  pPro = Extra_ProgressBarStart((FILE *)_stdout,pMan->TimeLimit);
  aVar4 = Abc_Clock();
  pMan->TimePrint = aVar4 + 1000000;
  ppG1 = (Super_Gate_t_conflict **)malloc((long)pMan->nGates << 3);
  iPruneLimit = 0;
  t = 0;
  do {
    if ((nGates <= t) || (iPruneLimit != 0)) {
LAB_004ce2d2:
      Extra_ProgressBarStop(pPro);
      if (ppG1 != (Super_Gate_t_conflict **)0x0) {
        free(ppG1);
      }
      return pMan;
    }
    if ((pMan->nLevels < 1) || (iVar2 = Mio_GateReadPinNum(ppGates[t]), iVar2 < 4)) {
      dVar13 = Mio_GateReadDelayMax(ppGates[t]);
      pProgress._4_4_ = 0;
      for (local_168 = 0; local_168 < pMan->nGates; local_168 = local_168 + 1) {
        if ((pMan->nLevels < 1) || ((*(uint *)&pMan->pGates[local_168]->field_0x8 >> 2 & 0x3f) < 3))
        {
          ppG1[(int)pProgress._4_4_] = pMan->pGates[local_168];
          uVar6 = pProgress._4_4_ + 1;
          fVar8 = ppG1[(int)pProgress._4_4_]->tDelayMax + (float)dVar13;
          pProgress._4_4_ = uVar6;
          if ((pMan->tDelayMax <= fVar8 && fVar8 != pMan->tDelayMax) && (0.0 < pMan->tDelayMax))
          break;
        }
      }
      if (pMan->fVerbose != 0) {
        uVar6 = Mio_GateReadPinNum(ppGates[t]);
        printf("Trying %d choices for %d inputs\r",(ulong)pProgress._4_4_,(ulong)uVar6);
      }
      if (10000 < (int)pProgress._4_4_) {
        printf("Sorting array of %d supergates...\r",(ulong)pProgress._4_4_);
      }
      qsort(ppG1,(long)(int)pProgress._4_4_,8,Super_AreaCompare);
      iVar2 = Super_AreaCompare(ppG1,ppG1 + (long)(int)pProgress._4_4_ + -1);
      if (0 < iVar2) {
        __assert_fail("Super_AreaCompare( ppGatesLimit, ppGatesLimit + nGatesLimit - 1 ) <= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                      ,0x1ad,
                      "Super_Man_t *Super_Compute(Super_Man_t *, Mio_Gate_t **, int, int, int)");
      }
      if (10000 < (int)pProgress._4_4_) {
        printf("                                       \r");
      }
      dVar13 = Mio_GateReadArea(ppGates[t]);
      fVar8 = (float)dVar13;
      iVar2 = Mio_GateReadPinNum(ppGates[t]);
      switch(iVar2) {
      case 0:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                      ,0x1b7,
                      "Super_Man_t *Super_Compute(Super_Man_t *, Mio_Gate_t **, int, int, int)");
      case 1:
        i2 = 0;
        while( true ) {
          bVar7 = false;
          if (i2 < (int)pProgress._4_4_) {
            pGate1 = ppG1[i2];
            bVar7 = pGate1 != (Super_Gate_t_conflict *)0x0;
          }
          if ((!bVar7) || (iPruneLimit != 0)) break;
          iPruneLimit = Super_CheckTimeout(pPro,pMan);
          if ((pSupers[5]._4_4_ == 0) || ((pGate1->tDelayMax != 0.0 || (NAN(pGate1->tDelayMax))))) {
            Area1 = fVar8 + pGate1->Area;
            if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax <= Area1 && Area1 != pMan->tAreaMax))
            break;
            pGate0 = pGate1;
            i1 = pGate1->uTruth[0];
            i0 = pGate1->uTruth[1];
            _tDelayMio = pGate1->ptDelays;
            Mio_DeriveGateDelays
                      (ppGates[t],(float **)&tDelayMio,iVar2,pMan->nVarsMax,-9999.0,
                       (float *)(ptPinDelays + 5),&Area);
            Mio_DeriveTruthTable(ppGates[t],(uint (*) [2])&i1,iVar2,pMan->nVarsMax,uTruths[5] + 1);
            iVar3 = Super_CompareGates(pMan,uTruths[5] + 1,Area1,(float *)(ptPinDelays + 5),
                                       pMan->nVarsMax);
            if (iVar3 != 0) {
              pSVar5 = Super_CreateGateNew(pMan,ppGates[t],&pGate0,iVar2,uTruths[5] + 1,Area1,
                                           (float *)(ptPinDelays + 5),Area,pMan->nVarsMax);
              Super_AddGateToTable(pMan,pSVar5);
              if ((nGatesMax != 0) && (nGatesMax < pMan->nClasses)) goto LAB_004ce2d2;
            }
          }
          i2 = i2 + 1;
        }
        break;
      case 2:
        i2 = 0;
LAB_004cc84e:
        bVar7 = false;
        if (i2 < (int)pProgress._4_4_) {
          pGate1 = ppG1[i2];
          bVar7 = pGate1 != (Super_Gate_t_conflict *)0x0;
        }
        if ((bVar7) &&
           ((fVar9 = fVar8 + pGate1->Area, pMan->tAreaMax <= 0.0 ||
            (fVar9 < pMan->tAreaMax || fVar9 == pMan->tAreaMax)))) {
          pGate0 = pGate1;
          i1 = pGate1->uTruth[0];
          i0 = pGate1->uTruth[1];
          _tDelayMio = pGate1->ptDelays;
          i3 = 0;
          do {
            bVar7 = false;
            if (i3 < (int)pProgress._4_4_) {
              pGate2 = ppG1[i3];
              bVar7 = pGate2 != (Super_Gate_t_conflict *)0x0;
            }
            if (!bVar7) goto LAB_004ccb39;
            if (i3 != i2) {
              if (iPruneLimit != 0) goto LAB_004ce2d2;
              iPruneLimit = Super_CheckTimeout(pPro,pMan);
              Area1 = fVar9 + pGate2->Area;
              if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax <= Area1 && Area1 != pMan->tAreaMax))
              goto LAB_004ccb39;
              pSupers[0] = pGate2;
              uTruths[0][0] = pGate2->uTruth[0];
              uTruths[0][1] = pGate2->uTruth[1];
              ptPinDelays[0] = pGate2->ptDelays;
              Mio_DeriveGateDelays
                        (ppGates[t],(float **)&tDelayMio,iVar2,pMan->nVarsMax,-9999.0,
                         (float *)(ptPinDelays + 5),&Area);
              Mio_DeriveTruthTable(ppGates[t],(uint (*) [2])&i1,iVar2,pMan->nVarsMax,uTruths[5] + 1)
              ;
              iVar3 = Super_CompareGates(pMan,uTruths[5] + 1,Area1,(float *)(ptPinDelays + 5),
                                         pMan->nVarsMax);
              if (iVar3 != 0) {
                pSVar5 = Super_CreateGateNew(pMan,ppGates[t],&pGate0,iVar2,uTruths[5] + 1,Area1,
                                             (float *)(ptPinDelays + 5),Area,pMan->nVarsMax);
                Super_AddGateToTable(pMan,pSVar5);
                if ((nGatesMax != 0) && (nGatesMax < pMan->nClasses)) goto LAB_004ce2d2;
              }
            }
            i3 = i3 + 1;
          } while( true );
        }
        break;
      case 3:
        i2 = 0;
        while( true ) {
          bVar7 = false;
          if (i2 < (int)pProgress._4_4_) {
            pGate1 = ppG1[i2];
            bVar7 = pGate1 != (Super_Gate_t_conflict *)0x0;
          }
          if ((!bVar7) ||
             ((fVar9 = fVar8 + pGate1->Area, 0.0 < pMan->tAreaMax &&
              (pMan->tAreaMax <= fVar9 && fVar9 != pMan->tAreaMax)))) break;
          pGate0 = pGate1;
          i1 = pGate1->uTruth[0];
          i0 = pGate1->uTruth[1];
          _tDelayMio = pGate1->ptDelays;
          i3 = 0;
          while( true ) {
            bVar7 = false;
            if (i3 < (int)pProgress._4_4_) {
              pGate2 = ppG1[i3];
              bVar7 = pGate2 != (Super_Gate_t_conflict *)0x0;
            }
            if (!bVar7) goto LAB_004ccf50;
            if (i3 != i2) break;
LAB_004ccf38:
            i3 = i3 + 1;
          }
          fVar10 = fVar9 + pGate2->Area;
          if ((pMan->tAreaMax <= 0.0) || (fVar10 < pMan->tAreaMax || fVar10 == pMan->tAreaMax)) {
            pSupers[0] = pGate2;
            uTruths[0][0] = pGate2->uTruth[0];
            uTruths[0][1] = pGate2->uTruth[1];
            ptPinDelays[0] = pGate2->ptDelays;
            i4 = 0;
            do {
              bVar7 = false;
              if (i4 < (int)pProgress._4_4_) {
                pGate3 = ppG1[i4];
                bVar7 = pGate3 != (Super_Gate_t_conflict *)0x0;
              }
              if (!bVar7) goto LAB_004ccf38;
              if ((i4 != i2) && (i4 != i3)) {
                if (iPruneLimit != 0) goto LAB_004ce2d2;
                iPruneLimit = Super_CheckTimeout(pPro,pMan);
                Area1 = fVar10 + pGate3->Area;
                if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax <= Area1 && Area1 != pMan->tAreaMax))
                goto LAB_004ccf38;
                pSupers[1] = pGate3;
                uTruths[1][0] = pGate3->uTruth[0];
                uTruths[1][1] = pGate3->uTruth[1];
                ptPinDelays[1] = pGate3->ptDelays;
                Mio_DeriveGateDelays
                          (ppGates[t],(float **)&tDelayMio,iVar2,pMan->nVarsMax,-9999.0,
                           (float *)(ptPinDelays + 5),&Area);
                Mio_DeriveTruthTable
                          (ppGates[t],(uint (*) [2])&i1,iVar2,pMan->nVarsMax,uTruths[5] + 1);
                iVar3 = Super_CompareGates(pMan,uTruths[5] + 1,Area1,(float *)(ptPinDelays + 5),
                                           pMan->nVarsMax);
                if (iVar3 != 0) {
                  pSVar5 = Super_CreateGateNew(pMan,ppGates[t],&pGate0,iVar2,uTruths[5] + 1,Area1,
                                               (float *)(ptPinDelays + 5),Area,pMan->nVarsMax);
                  Super_AddGateToTable(pMan,pSVar5);
                  if ((nGatesMax != 0) && (nGatesMax < pMan->nClasses)) goto LAB_004ce2d2;
                }
              }
              i4 = i4 + 1;
            } while( true );
          }
LAB_004ccf50:
          i2 = i2 + 1;
        }
        break;
      case 4:
        i2 = 0;
LAB_004ccf73:
        bVar7 = false;
        if (i2 < (int)pProgress._4_4_) {
          pGate1 = ppG1[i2];
          bVar7 = pGate1 != (Super_Gate_t_conflict *)0x0;
        }
        if ((bVar7) &&
           ((fVar9 = fVar8 + pGate1->Area, pMan->tAreaMax <= 0.0 ||
            (fVar9 < pMan->tAreaMax || fVar9 == pMan->tAreaMax)))) {
          pGate0 = pGate1;
          i1 = pGate1->uTruth[0];
          i0 = pGate1->uTruth[1];
          _tDelayMio = pGate1->ptDelays;
          i3 = 0;
          do {
            bVar7 = false;
            if (i3 < (int)pProgress._4_4_) {
              pGate2 = ppG1[i3];
              bVar7 = pGate2 != (Super_Gate_t_conflict *)0x0;
            }
            if (!bVar7) goto LAB_004cd47c;
            if (i3 != i2) {
              fVar10 = fVar9 + pGate2->Area;
              if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax <= fVar10 && fVar10 != pMan->tAreaMax))
              goto LAB_004cd47c;
              pSupers[0] = pGate2;
              uTruths[0][0] = pGate2->uTruth[0];
              uTruths[0][1] = pGate2->uTruth[1];
              ptPinDelays[0] = pGate2->ptDelays;
              i4 = 0;
              while( true ) {
                bVar7 = false;
                if (i4 < (int)pProgress._4_4_) {
                  pGate3 = ppG1[i4];
                  bVar7 = pGate3 != (Super_Gate_t_conflict *)0x0;
                }
                if (!bVar7) goto LAB_004cd464;
                if ((i4 != i2) && (i4 != i3)) break;
LAB_004cd44c:
                i4 = i4 + 1;
              }
              fVar11 = fVar10 + pGate3->Area;
              if ((pMan->tAreaMax <= 0.0) || (fVar11 < pMan->tAreaMax || fVar11 == pMan->tAreaMax))
              {
                pSupers[1] = pGate3;
                uTruths[1][0] = pGate3->uTruth[0];
                uTruths[1][1] = pGate3->uTruth[1];
                ptPinDelays[1] = pGate3->ptDelays;
                i5 = 0;
                do {
                  bVar7 = false;
                  if (i5 < (int)pProgress._4_4_) {
                    pGate4 = ppG1[i5];
                    bVar7 = pGate4 != (Super_Gate_t_conflict *)0x0;
                  }
                  if (!bVar7) goto LAB_004cd44c;
                  if (((i5 != i2) && (i5 != i3)) && (i5 != i4)) {
                    if (iPruneLimit != 0) goto LAB_004ce2d2;
                    iPruneLimit = Super_CheckTimeout(pPro,pMan);
                    Area1 = fVar11 + pGate4->Area;
                    if ((0.0 < pMan->tAreaMax) &&
                       (pMan->tAreaMax <= Area1 && Area1 != pMan->tAreaMax)) goto LAB_004cd44c;
                    pSupers[2] = pGate4;
                    uTruths[2][0] = pGate4->uTruth[0];
                    uTruths[2][1] = pGate4->uTruth[1];
                    ptPinDelays[2] = pGate4->ptDelays;
                    Mio_DeriveGateDelays
                              (ppGates[t],(float **)&tDelayMio,iVar2,pMan->nVarsMax,-9999.0,
                               (float *)(ptPinDelays + 5),&Area);
                    Mio_DeriveTruthTable
                              (ppGates[t],(uint (*) [2])&i1,iVar2,pMan->nVarsMax,uTruths[5] + 1);
                    iVar3 = Super_CompareGates(pMan,uTruths[5] + 1,Area1,(float *)(ptPinDelays + 5),
                                               pMan->nVarsMax);
                    if (iVar3 != 0) {
                      pSVar5 = Super_CreateGateNew(pMan,ppGates[t],&pGate0,iVar2,uTruths[5] + 1,
                                                   Area1,(float *)(ptPinDelays + 5),Area,
                                                   pMan->nVarsMax);
                      Super_AddGateToTable(pMan,pSVar5);
                      if ((nGatesMax != 0) && (nGatesMax < pMan->nClasses)) goto LAB_004ce2d2;
                    }
                  }
                  i5 = i5 + 1;
                } while( true );
              }
            }
LAB_004cd464:
            i3 = i3 + 1;
          } while( true );
        }
        break;
      case 5:
        i2 = 0;
        while( true ) {
          bVar7 = false;
          if (i2 < (int)pProgress._4_4_) {
            pGate1 = ppG1[i2];
            bVar7 = pGate1 != (Super_Gate_t_conflict *)0x0;
          }
          if ((!bVar7) ||
             ((fVar9 = fVar8 + pGate1->Area, 0.0 < pMan->tAreaMax &&
              (pMan->tAreaMax <= fVar9 && fVar9 != pMan->tAreaMax)))) break;
          pGate0 = pGate1;
          i1 = pGate1->uTruth[0];
          i0 = pGate1->uTruth[1];
          _tDelayMio = pGate1->ptDelays;
          i3 = 0;
          while( true ) {
            bVar7 = false;
            if (i3 < (int)pProgress._4_4_) {
              pGate2 = ppG1[i3];
              bVar7 = pGate2 != (Super_Gate_t_conflict *)0x0;
            }
            if (!bVar7) goto LAB_004cdad1;
            if (i3 != i2) break;
LAB_004cdab9:
            i3 = i3 + 1;
          }
          fVar10 = fVar9 + pGate2->Area;
          if ((pMan->tAreaMax <= 0.0) || (fVar10 < pMan->tAreaMax || fVar10 == pMan->tAreaMax)) {
            pSupers[0] = pGate2;
            uTruths[0][0] = pGate2->uTruth[0];
            uTruths[0][1] = pGate2->uTruth[1];
            ptPinDelays[0] = pGate2->ptDelays;
            i4 = 0;
            do {
              bVar7 = false;
              if (i4 < (int)pProgress._4_4_) {
                pGate3 = ppG1[i4];
                bVar7 = pGate3 != (Super_Gate_t_conflict *)0x0;
              }
              if (!bVar7) goto LAB_004cdab9;
              if ((i4 != i2) && (i4 != i3)) {
                fVar11 = fVar10 + pGate3->Area;
                if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax <= fVar11 && fVar11 != pMan->tAreaMax)
                   ) goto LAB_004cdab9;
                pSupers[1] = pGate3;
                uTruths[1][0] = pGate3->uTruth[0];
                uTruths[1][1] = pGate3->uTruth[1];
                ptPinDelays[1] = pGate3->ptDelays;
                i5 = 0;
                while( true ) {
                  bVar7 = false;
                  if (i5 < (int)pProgress._4_4_) {
                    pGate4 = ppG1[i5];
                    bVar7 = pGate4 != (Super_Gate_t_conflict *)0x0;
                  }
                  if (!bVar7) goto LAB_004cdaa1;
                  if (((i5 != i2) && (i5 != i3)) && (i5 != i4)) break;
LAB_004cda89:
                  i5 = i5 + 1;
                }
                fVar12 = fVar11 + pGate4->Area;
                if ((pMan->tAreaMax <= 0.0) || (fVar12 < pMan->tAreaMax || fVar12 == pMan->tAreaMax)
                   ) {
                  pSupers[2] = pGate4;
                  uTruths[2][0] = pGate4->uTruth[0];
                  uTruths[2][1] = pGate4->uTruth[1];
                  ptPinDelays[2] = pGate4->ptDelays;
                  ppGatesLimit._4_4_ = 0;
                  do {
                    bVar7 = false;
                    if (ppGatesLimit._4_4_ < (int)pProgress._4_4_) {
                      pGate5 = ppG1[ppGatesLimit._4_4_];
                      bVar7 = pGate5 != (Super_Gate_t_conflict *)0x0;
                    }
                    if (!bVar7) goto LAB_004cda89;
                    if (((ppGatesLimit._4_4_ != i2) && (ppGatesLimit._4_4_ != i3)) &&
                       ((ppGatesLimit._4_4_ != i4 && (ppGatesLimit._4_4_ != i5)))) {
                      if (iPruneLimit != 0) goto LAB_004ce2d2;
                      iPruneLimit = Super_CheckTimeout(pPro,pMan);
                      Area1 = fVar12 + pGate5->Area;
                      if ((0.0 < pMan->tAreaMax) &&
                         (pMan->tAreaMax <= Area1 && Area1 != pMan->tAreaMax)) goto LAB_004cda89;
                      pSupers[3] = pGate5;
                      uTruths[3][0] = pGate5->uTruth[0];
                      uTruths[3][1] = pGate5->uTruth[1];
                      ptPinDelays[3] = pGate5->ptDelays;
                      Mio_DeriveGateDelays
                                (ppGates[t],(float **)&tDelayMio,iVar2,pMan->nVarsMax,-9999.0,
                                 (float *)(ptPinDelays + 5),&Area);
                      Mio_DeriveTruthTable
                                (ppGates[t],(uint (*) [2])&i1,iVar2,pMan->nVarsMax,uTruths[5] + 1);
                      iVar3 = Super_CompareGates(pMan,uTruths[5] + 1,Area1,
                                                 (float *)(ptPinDelays + 5),pMan->nVarsMax);
                      if (iVar3 != 0) {
                        pSVar5 = Super_CreateGateNew(pMan,ppGates[t],&pGate0,iVar2,uTruths[5] + 1,
                                                     Area1,(float *)(ptPinDelays + 5),Area,
                                                     pMan->nVarsMax);
                        Super_AddGateToTable(pMan,pSVar5);
                        if ((nGatesMax != 0) && (nGatesMax < pMan->nClasses)) goto LAB_004ce2d2;
                      }
                    }
                    ppGatesLimit._4_4_ = ppGatesLimit._4_4_ + 1;
                  } while( true );
                }
              }
LAB_004cdaa1:
              i4 = i4 + 1;
            } while( true );
          }
LAB_004cdad1:
          i2 = i2 + 1;
        }
        break;
      case 6:
        i2 = 0;
LAB_004cdaf4:
        bVar7 = false;
        if (i2 < (int)pProgress._4_4_) {
          pGate1 = ppG1[i2];
          bVar7 = pGate1 != (Super_Gate_t_conflict *)0x0;
        }
        if ((bVar7) &&
           ((fVar9 = fVar8 + pGate1->Area, pMan->tAreaMax <= 0.0 ||
            (fVar9 < pMan->tAreaMax || fVar9 == pMan->tAreaMax)))) {
          pGate0 = pGate1;
          i1 = pGate1->uTruth[0];
          i0 = pGate1->uTruth[1];
          _tDelayMio = pGate1->ptDelays;
          i3 = 0;
          do {
            bVar7 = false;
            if (i3 < (int)pProgress._4_4_) {
              pGate2 = ppG1[i3];
              bVar7 = pGate2 != (Super_Gate_t_conflict *)0x0;
            }
            if (!bVar7) goto LAB_004ce285;
            if (i3 != i2) {
              fVar10 = fVar9 + pGate2->Area;
              if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax <= fVar10 && fVar10 != pMan->tAreaMax))
              goto LAB_004ce285;
              pSupers[0] = pGate2;
              uTruths[0][0] = pGate2->uTruth[0];
              uTruths[0][1] = pGate2->uTruth[1];
              ptPinDelays[0] = pGate2->ptDelays;
              i4 = 0;
              while( true ) {
                bVar7 = false;
                if (i4 < (int)pProgress._4_4_) {
                  pGate3 = ppG1[i4];
                  bVar7 = pGate3 != (Super_Gate_t_conflict *)0x0;
                }
                if (!bVar7) goto LAB_004ce26d;
                if ((i4 != i2) && (i4 != i3)) break;
LAB_004ce255:
                i4 = i4 + 1;
              }
              fVar11 = fVar10 + pGate3->Area;
              if ((pMan->tAreaMax <= 0.0) || (fVar11 < pMan->tAreaMax || fVar11 == pMan->tAreaMax))
              {
                pSupers[1] = pGate3;
                uTruths[1][0] = pGate3->uTruth[0];
                uTruths[1][1] = pGate3->uTruth[1];
                ptPinDelays[1] = pGate3->ptDelays;
                i5 = 0;
                do {
                  bVar7 = false;
                  if (i5 < (int)pProgress._4_4_) {
                    pGate4 = ppG1[i5];
                    bVar7 = pGate4 != (Super_Gate_t_conflict *)0x0;
                  }
                  if (!bVar7) goto LAB_004ce255;
                  if (((i5 != i2) && (i5 != i3)) && (i5 != i4)) {
                    fVar12 = fVar11 + pGate4->Area;
                    if ((0.0 < pMan->tAreaMax) &&
                       (pMan->tAreaMax <= fVar12 && fVar12 != pMan->tAreaMax)) goto LAB_004ce255;
                    pSupers[2] = pGate4;
                    uTruths[2][0] = pGate4->uTruth[0];
                    uTruths[2][1] = pGate4->uTruth[1];
                    ptPinDelays[2] = pGate4->ptDelays;
                    ppGatesLimit._4_4_ = 0;
                    while( true ) {
                      bVar7 = false;
                      if (ppGatesLimit._4_4_ < (int)pProgress._4_4_) {
                        pGate5 = ppG1[ppGatesLimit._4_4_];
                        bVar7 = pGate5 != (Super_Gate_t_conflict *)0x0;
                      }
                      if (!bVar7) goto LAB_004ce23d;
                      if (((ppGatesLimit._4_4_ != i2) && (ppGatesLimit._4_4_ != i3)) &&
                         ((ppGatesLimit._4_4_ != i4 && (ppGatesLimit._4_4_ != i5)))) break;
LAB_004ce225:
                      ppGatesLimit._4_4_ = ppGatesLimit._4_4_ + 1;
                    }
                    if (iPruneLimit == 0) {
                      iPruneLimit = Super_CheckTimeout(pPro,pMan);
                      fVar1 = pGate5->Area;
                      if ((pMan->tAreaMax <= 0.0) ||
                         (Area1 < pMan->tAreaMax || Area1 == pMan->tAreaMax)) {
                        pSupers[3] = pGate5;
                        uTruths[3][0] = pGate5->uTruth[0];
                        uTruths[3][1] = pGate5->uTruth[1];
                        ptPinDelays[3] = pGate5->ptDelays;
                        ppGatesLimit._0_4_ = 0;
                        do {
                          bVar7 = false;
                          if ((int)ppGatesLimit < (int)pProgress._4_4_) {
                            pGateNew = ppG1[(int)ppGatesLimit];
                            bVar7 = pGateNew != (Super_Gate_t_conflict *)0x0;
                          }
                          if (!bVar7) goto LAB_004ce225;
                          if (((((int)ppGatesLimit != i2) && ((int)ppGatesLimit != i3)) &&
                              ((int)ppGatesLimit != i4)) &&
                             (((int)ppGatesLimit != i5 && ((int)ppGatesLimit != ppGatesLimit._4_4_))
                             )) {
                            if (iPruneLimit != 0) goto LAB_004ce2d2;
                            iPruneLimit = Super_CheckTimeout(pPro,pMan);
                            Area1 = fVar12 + fVar1 + pGateNew->Area;
                            if ((0.0 < pMan->tAreaMax) &&
                               (pMan->tAreaMax <= Area1 && Area1 != pMan->tAreaMax))
                            goto LAB_004ce225;
                            pSupers[4] = pGateNew;
                            uTruths[4][0] = pGateNew->uTruth[0];
                            uTruths[4][1] = pGateNew->uTruth[1];
                            ptPinDelays[4] = pGateNew->ptDelays;
                            Mio_DeriveGateDelays
                                      (ppGates[t],(float **)&tDelayMio,iVar2,pMan->nVarsMax,-9999.0,
                                       (float *)(ptPinDelays + 5),&Area);
                            Mio_DeriveTruthTable
                                      (ppGates[t],(uint (*) [2])&i1,iVar2,pMan->nVarsMax,
                                       uTruths[5] + 1);
                            iVar3 = Super_CompareGates(pMan,uTruths[5] + 1,Area1,
                                                       (float *)(ptPinDelays + 5),pMan->nVarsMax);
                            if (iVar3 != 0) {
                              pSVar5 = Super_CreateGateNew(pMan,ppGates[t],&pGate0,iVar2,
                                                           uTruths[5] + 1,Area1,
                                                           (float *)(ptPinDelays + 5),Area,
                                                           pMan->nVarsMax);
                              Super_AddGateToTable(pMan,pSVar5);
                              if ((nGatesMax != 0) && (nGatesMax < pMan->nClasses))
                              goto LAB_004ce2d2;
                            }
                          }
                          ppGatesLimit._0_4_ = (int)ppGatesLimit + 1;
                        } while( true );
                      }
                    }
                  }
LAB_004ce23d:
                  i5 = i5 + 1;
                } while( true );
              }
            }
LAB_004ce26d:
            i3 = i3 + 1;
          } while( true );
        }
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                      ,0x2cc,
                      "Super_Man_t *Super_Compute(Super_Man_t *, Mio_Gate_t **, int, int, int)");
      }
    }
    t = t + 1;
  } while( true );
LAB_004ce285:
  i2 = i2 + 1;
  goto LAB_004cdaf4;
LAB_004cd47c:
  i2 = i2 + 1;
  goto LAB_004ccf73;
LAB_004ccb39:
  i2 = i2 + 1;
  goto LAB_004cc84e;
}

Assistant:

Super_Man_t * Super_Compute( Super_Man_t * pMan, Mio_Gate_t ** ppGates, int nGates, int nGatesMax, int fSkipInv )
{
    Super_Gate_t * pSupers[6], * pGate0, * pGate1, * pGate2, * pGate3, * pGate4, * pGate5, * pGateNew;
    float tPinDelaysRes[6], * ptPinDelays[6], tPinDelayMax, tDelayMio;
    float Area = 0.0; // Suppress "might be used uninitialized"
    float Area0, Area1, Area2, Area3, Area4, AreaMio;
    unsigned uTruth[2], uTruths[6][2];
    int i0, i1, i2, i3, i4, i5; 
    Super_Gate_t ** ppGatesLimit;
    int nFanins, nGatesLimit, k, s, t;
    ProgressBar * pProgress;
    int fTimeOut;
    int fPrune = 1;                     // Shall we prune?
    int iPruneLimit = 3;                // Each of the gates plugged into the root gate will have 
                                        // less than these many fanins
    int iPruneLimitRoot = 4;            // The root gate may have only less than these many fanins

    // put the gates from the unique table into the array
    // the gates from the array will be used to compose other gates
    // the gates in tbe table are used to check uniqueness of collected gates
    Super_TranferGatesToArray( pMan );

    // sort the gates in the increasing order of maximum delay
    if ( pMan->nGates > 10000 )
    {
        printf( "Sorting array of %d supergates...\r", pMan->nGates );
        fflush( stdout );
    }
    qsort( (void *)pMan->pGates, (size_t)pMan->nGates, sizeof(Super_Gate_t *), 
            (int (*)(const void *, const void *)) Super_DelayCompare );
    assert( Super_DelayCompare( pMan->pGates, pMan->pGates + pMan->nGates - 1 ) <= 0 );
    if ( pMan->nGates > 10000 )
    {
        printf( "                                       \r" );
    }

    pProgress = Extra_ProgressBarStart( stdout, pMan->TimeLimit );
    pMan->TimePrint = Abc_Clock() + CLOCKS_PER_SEC;
    ppGatesLimit = ABC_ALLOC( Super_Gate_t *, pMan->nGates );
    // go through the root gates
    // the root gates are sorted in the increasing gelay
    fTimeOut = 0;
    for ( k = 0; k < nGates; k++ )
    {
        if ( fTimeOut ) break;

        if ( fPrune )
        {
            if ( pMan->nLevels >= 1 )  // First level gates have been computed
            {
                if ( Mio_GateReadPinNum(ppGates[k]) >= iPruneLimitRoot )
                    continue;
            }
        }
/*
        if ( strcmp(Mio_GateReadName(ppGates[k]), "MUX2IX0") == 0 )
        {
            int s = 0;
        }
*/
        // select the subset of gates to be considered with this root gate
        // all the gates past this point will lead to delay larger than the limit
        tDelayMio = (float)Mio_GateReadDelayMax(ppGates[k]);
        for ( s = 0, t = 0; s < pMan->nGates; s++ )
        {
            if ( fPrune && ( pMan->nLevels >= 1 ) && ( ((int)pMan->pGates[s]->nFanins) >= iPruneLimit ))
                continue;
            
            ppGatesLimit[t] = pMan->pGates[s];
            if ( ppGatesLimit[t++]->tDelayMax + tDelayMio > pMan->tDelayMax && pMan->tDelayMax > 0.0 )
                break;
        }
        nGatesLimit = t;

        if ( pMan->fVerbose )
        {
            printf ("Trying %d choices for %d inputs\r", t, Mio_GateReadPinNum(ppGates[k]) );
        }

        // resort part of this range by area
        // now we can prune the search by going up in the list until we reach the limit on area
        // all the gates beyond this point can be skipped because their area can be only larger
        if ( nGatesLimit > 10000 )
            printf( "Sorting array of %d supergates...\r", nGatesLimit );
        qsort( (void *)ppGatesLimit, (size_t)nGatesLimit, sizeof(Super_Gate_t *), 
                (int (*)(const void *, const void *)) Super_AreaCompare );
        assert( Super_AreaCompare( ppGatesLimit, ppGatesLimit + nGatesLimit - 1 ) <= 0 );
        if ( nGatesLimit > 10000 )
            printf( "                                       \r" );

        // consider the combinations of gates with the root gate on top
        AreaMio = (float)Mio_GateReadArea(ppGates[k]);
        nFanins = Mio_GateReadPinNum(ppGates[k]);
        switch ( nFanins )
        {
        case 0: // should not happen
            assert( 0 ); 
            break;
        case 1: // interter root
            Super_ManForEachGate( ppGatesLimit, nGatesLimit, i0, pGate0 )
            {
              if ( fTimeOut ) break;
              fTimeOut = Super_CheckTimeout( pProgress, pMan );
              // skip the inverter as the root gate before the elementary variable
              // as a result, the supergates will not have inverters on the input side
              // but inverters still may occur at the output of or inside complex supergates
              if ( fSkipInv && pGate0->tDelayMax == 0 )
                  continue;
              // compute area
              Area = AreaMio + pGate0->Area;
              if ( pMan->tAreaMax > 0.0 && Area > pMan->tAreaMax )
                  break;

              pSupers[0] = pGate0;  uTruths[0][0] = pGate0->uTruth[0];  uTruths[0][1] = pGate0->uTruth[1];  ptPinDelays[0] = pGate0->ptDelays; 
              Mio_DeriveGateDelays( ppGates[k], ptPinDelays, nFanins, pMan->nVarsMax, SUPER_NO_VAR, tPinDelaysRes, &tPinDelayMax );
              Mio_DeriveTruthTable( ppGates[k], uTruths, nFanins, pMan->nVarsMax, uTruth );
              if ( !Super_CompareGates( pMan, uTruth, Area, tPinDelaysRes, pMan->nVarsMax ) )
                  continue;
              // create a new gate
              pGateNew = Super_CreateGateNew( pMan, ppGates[k], pSupers, nFanins, uTruth, Area, tPinDelaysRes, tPinDelayMax, pMan->nVarsMax );
              Super_AddGateToTable( pMan, pGateNew );
              if ( nGatesMax && pMan->nClasses > nGatesMax )
                  goto done;
            }
            break;
        case 2: // two-input root gate
            Super_ManForEachGate( ppGatesLimit, nGatesLimit, i0, pGate0 )
            {
              Area0 = AreaMio + pGate0->Area;
              if ( pMan->tAreaMax > 0.0 && Area0 > pMan->tAreaMax )
                  break;
              pSupers[0] = pGate0;  uTruths[0][0] = pGate0->uTruth[0];  uTruths[0][1] = pGate0->uTruth[1];  ptPinDelays[0] = pGate0->ptDelays; 
              Super_ManForEachGate( ppGatesLimit, nGatesLimit, i1, pGate1 )
              if ( i1 != i0 )
              {
                if ( fTimeOut ) goto done;
                fTimeOut = Super_CheckTimeout( pProgress, pMan );
                // compute area
                Area = Area0 + pGate1->Area;
                if ( pMan->tAreaMax > 0.0 && Area > pMan->tAreaMax )
                    break;

                pSupers[1] = pGate1;  uTruths[1][0] = pGate1->uTruth[0];  uTruths[1][1] = pGate1->uTruth[1];  ptPinDelays[1] = pGate1->ptDelays;
                Mio_DeriveGateDelays( ppGates[k], ptPinDelays, nFanins, pMan->nVarsMax, SUPER_NO_VAR, tPinDelaysRes, &tPinDelayMax );
                Mio_DeriveTruthTable( ppGates[k], uTruths, nFanins, pMan->nVarsMax, uTruth );
                if ( !Super_CompareGates( pMan, uTruth, Area, tPinDelaysRes, pMan->nVarsMax ) )
                    continue;
                // create a new gate
                pGateNew = Super_CreateGateNew( pMan, ppGates[k], pSupers, nFanins, uTruth, Area, tPinDelaysRes, tPinDelayMax, pMan->nVarsMax );
                Super_AddGateToTable( pMan, pGateNew );
                if ( nGatesMax && pMan->nClasses > nGatesMax )
                    goto done;
              }
            }
            break;
        case 3: // three-input root gate
            Super_ManForEachGate( ppGatesLimit, nGatesLimit, i0, pGate0 )
            {
              Area0 = AreaMio + pGate0->Area;
              if ( pMan->tAreaMax > 0.0 && Area0 > pMan->tAreaMax )
                  break;
              pSupers[0] = pGate0;  uTruths[0][0] = pGate0->uTruth[0];  uTruths[0][1] = pGate0->uTruth[1];  ptPinDelays[0] = pGate0->ptDelays; 

              Super_ManForEachGate( ppGatesLimit, nGatesLimit, i1, pGate1 )
              if ( i1 != i0 )
              {
                Area1 = Area0 + pGate1->Area;
                if ( pMan->tAreaMax > 0.0 && Area1 > pMan->tAreaMax )
                    break;
                pSupers[1] = pGate1;  uTruths[1][0] = pGate1->uTruth[0];  uTruths[1][1] = pGate1->uTruth[1];  ptPinDelays[1] = pGate1->ptDelays;

                Super_ManForEachGate( ppGatesLimit, nGatesLimit, i2, pGate2 )
                if ( i2 != i0 && i2 != i1 )
                {
                  if ( fTimeOut ) goto done;
                  fTimeOut = Super_CheckTimeout( pProgress, pMan );
                  // compute area
                  Area = Area1 + pGate2->Area;
                  if ( pMan->tAreaMax > 0.0 && Area > pMan->tAreaMax )
                      break;
                  pSupers[2] = pGate2;  uTruths[2][0] = pGate2->uTruth[0];  uTruths[2][1] = pGate2->uTruth[1];   ptPinDelays[2] = pGate2->ptDelays;

                  Mio_DeriveGateDelays( ppGates[k], ptPinDelays, nFanins, pMan->nVarsMax, SUPER_NO_VAR, tPinDelaysRes, &tPinDelayMax );
                  Mio_DeriveTruthTable( ppGates[k], uTruths, nFanins, pMan->nVarsMax, uTruth );
                  if ( !Super_CompareGates( pMan, uTruth, Area, tPinDelaysRes, pMan->nVarsMax ) )
                      continue;
                  // create a new gate
                  pGateNew = Super_CreateGateNew( pMan, ppGates[k], pSupers, nFanins, uTruth, Area, tPinDelaysRes, tPinDelayMax, pMan->nVarsMax );
                  Super_AddGateToTable( pMan, pGateNew );
                  if ( nGatesMax && pMan->nClasses > nGatesMax )
                      goto done;
                }
              }
            }
            break;
        case 4: // four-input root gate
            Super_ManForEachGate( ppGatesLimit, nGatesLimit, i0, pGate0 )
            {
              Area0 = AreaMio + pGate0->Area;
              if ( pMan->tAreaMax > 0.0 && Area0 > pMan->tAreaMax )
                  break;
              pSupers[0] = pGate0;  uTruths[0][0] = pGate0->uTruth[0];  uTruths[0][1] = pGate0->uTruth[1];  ptPinDelays[0] = pGate0->ptDelays; 

              Super_ManForEachGate( ppGatesLimit, nGatesLimit, i1, pGate1 )
              if ( i1 != i0 )
              {
                Area1 = Area0 + pGate1->Area;
                if ( pMan->tAreaMax > 0.0 && Area1 > pMan->tAreaMax )
                    break;
                pSupers[1] = pGate1;  uTruths[1][0] = pGate1->uTruth[0];  uTruths[1][1] = pGate1->uTruth[1];  ptPinDelays[1] = pGate1->ptDelays;

                Super_ManForEachGate( ppGatesLimit, nGatesLimit, i2, pGate2 )
                if ( i2 != i0 && i2 != i1 )
                {
                  Area2 = Area1 + pGate2->Area;
                  if ( pMan->tAreaMax > 0.0 && Area2 > pMan->tAreaMax )
                      break;
                  pSupers[2] = pGate2;  uTruths[2][0] = pGate2->uTruth[0];  uTruths[2][1] = pGate2->uTruth[1];   ptPinDelays[2] = pGate2->ptDelays;

                  Super_ManForEachGate( ppGatesLimit, nGatesLimit, i3, pGate3 )
                  if ( i3 != i0 && i3 != i1 && i3 != i2 )
                  {
                    if ( fTimeOut ) goto done;
                    fTimeOut = Super_CheckTimeout( pProgress, pMan );
                    // compute area
                    Area = Area2 + pGate3->Area;
                    if ( pMan->tAreaMax > 0.0 && Area > pMan->tAreaMax )
                        break;
                    pSupers[3] = pGate3;   uTruths[3][0] = pGate3->uTruth[0];  uTruths[3][1] = pGate3->uTruth[1];   ptPinDelays[3] = pGate3->ptDelays;

                    Mio_DeriveGateDelays( ppGates[k], ptPinDelays, nFanins, pMan->nVarsMax, SUPER_NO_VAR, tPinDelaysRes, &tPinDelayMax );
                    Mio_DeriveTruthTable( ppGates[k], uTruths, nFanins, pMan->nVarsMax, uTruth );
                    if ( !Super_CompareGates( pMan, uTruth, Area, tPinDelaysRes, pMan->nVarsMax ) )
                        continue;
                    // create a new gate
                    pGateNew = Super_CreateGateNew( pMan, ppGates[k], pSupers, nFanins, uTruth, Area, tPinDelaysRes, tPinDelayMax, pMan->nVarsMax );
                    Super_AddGateToTable( pMan, pGateNew );
                    if ( nGatesMax && pMan->nClasses > nGatesMax )
                        goto done;
                  }
                }
              }
            }
            break;
        case 5: // five-input root gate
            Super_ManForEachGate( ppGatesLimit, nGatesLimit, i0, pGate0 )
            {
              Area0 = AreaMio + pGate0->Area;
              if ( pMan->tAreaMax > 0.0 && Area0 > pMan->tAreaMax )
                  break;
              pSupers[0] = pGate0;  uTruths[0][0] = pGate0->uTruth[0];  uTruths[0][1] = pGate0->uTruth[1];  ptPinDelays[0] = pGate0->ptDelays; 

              Super_ManForEachGate( ppGatesLimit, nGatesLimit, i1, pGate1 )
              if ( i1 != i0 )
              {
                Area1 = Area0 + pGate1->Area;
                if ( pMan->tAreaMax > 0.0 && Area1 > pMan->tAreaMax )
                    break;
                pSupers[1] = pGate1;  uTruths[1][0] = pGate1->uTruth[0];  uTruths[1][1] = pGate1->uTruth[1];  ptPinDelays[1] = pGate1->ptDelays;

                Super_ManForEachGate( ppGatesLimit, nGatesLimit, i2, pGate2 )
                if ( i2 != i0 && i2 != i1 )
                {
                  Area2 = Area1 + pGate2->Area;
                  if ( pMan->tAreaMax > 0.0 && Area2 > pMan->tAreaMax )
                      break;
                  pSupers[2] = pGate2;  uTruths[2][0] = pGate2->uTruth[0];  uTruths[2][1] = pGate2->uTruth[1];   ptPinDelays[2] = pGate2->ptDelays;

                  Super_ManForEachGate( ppGatesLimit, nGatesLimit, i3, pGate3 )
                  if ( i3 != i0 && i3 != i1 && i3 != i2 )
                  {
                    Area3 = Area2 + pGate3->Area;
                    if ( pMan->tAreaMax > 0.0 && Area3 > pMan->tAreaMax )
                        break;
                    pSupers[3] = pGate3;   uTruths[3][0] = pGate3->uTruth[0];  uTruths[3][1] = pGate3->uTruth[1];   ptPinDelays[3] = pGate3->ptDelays;

                    Super_ManForEachGate( ppGatesLimit, nGatesLimit, i4, pGate4 )
                    if ( i4 != i0 && i4 != i1 && i4 != i2 && i4 != i3 )
                    {
                      if ( fTimeOut ) goto done;
                      fTimeOut = Super_CheckTimeout( pProgress, pMan );
                      // compute area
                      Area = Area3 + pGate4->Area;
                      if ( pMan->tAreaMax > 0.0 && Area > pMan->tAreaMax )
                          break;
                      pSupers[4] = pGate4;   uTruths[4][0] = pGate4->uTruth[0];  uTruths[4][1] = pGate4->uTruth[1];  ptPinDelays[4] = pGate4->ptDelays;

                      Mio_DeriveGateDelays( ppGates[k], ptPinDelays, nFanins, pMan->nVarsMax, SUPER_NO_VAR, tPinDelaysRes, &tPinDelayMax );
                      Mio_DeriveTruthTable( ppGates[k], uTruths, nFanins, pMan->nVarsMax, uTruth );
                      if ( !Super_CompareGates( pMan, uTruth, Area, tPinDelaysRes, pMan->nVarsMax ) )
                          continue;
                      // create a new gate
                      pGateNew = Super_CreateGateNew( pMan, ppGates[k], pSupers, nFanins, uTruth, Area, tPinDelaysRes, tPinDelayMax, pMan->nVarsMax );
                      Super_AddGateToTable( pMan, pGateNew );
                      if ( nGatesMax && pMan->nClasses > nGatesMax )
                          goto done;
                    }
                  }
                }
              }
            }
            break;
        case 6: // six-input root gate
            Super_ManForEachGate( ppGatesLimit, nGatesLimit, i0, pGate0 )
            {
              Area0 = AreaMio + pGate0->Area;
              if ( pMan->tAreaMax > 0.0 && Area0 > pMan->tAreaMax )
                  break;
              pSupers[0] = pGate0;  uTruths[0][0] = pGate0->uTruth[0];  uTruths[0][1] = pGate0->uTruth[1];  ptPinDelays[0] = pGate0->ptDelays; 

              Super_ManForEachGate( ppGatesLimit, nGatesLimit, i1, pGate1 )
              if ( i1 != i0 )
              {
                Area1 = Area0 + pGate1->Area;
                if ( pMan->tAreaMax > 0.0 && Area1 > pMan->tAreaMax )
                    break;
                pSupers[1] = pGate1;  uTruths[1][0] = pGate1->uTruth[0];  uTruths[1][1] = pGate1->uTruth[1];  ptPinDelays[1] = pGate1->ptDelays;

                Super_ManForEachGate( ppGatesLimit, nGatesLimit, i2, pGate2 )
                if ( i2 != i0 && i2 != i1 )
                {
                  Area2 = Area1 + pGate2->Area;
                  if ( pMan->tAreaMax > 0.0 && Area2 > pMan->tAreaMax )
                      break;
                  pSupers[2] = pGate2;  uTruths[2][0] = pGate2->uTruth[0];  uTruths[2][1] = pGate2->uTruth[1];   ptPinDelays[2] = pGate2->ptDelays;

                  Super_ManForEachGate( ppGatesLimit, nGatesLimit, i3, pGate3 )
                  if ( i3 != i0 && i3 != i1 && i3 != i2 )
                  {
                    Area3 = Area2 + pGate3->Area;
                    if ( pMan->tAreaMax > 0.0 && Area3 > pMan->tAreaMax )
                        break;
                    pSupers[3] = pGate3;   uTruths[3][0] = pGate3->uTruth[0];  uTruths[3][1] = pGate3->uTruth[1];   ptPinDelays[3] = pGate3->ptDelays;

                    Super_ManForEachGate( ppGatesLimit, nGatesLimit, i4, pGate4 )
                    if ( i4 != i0 && i4 != i1 && i4 != i2 && i4 != i3 )
                    {
                      if ( fTimeOut ) break;
                      fTimeOut = Super_CheckTimeout( pProgress, pMan );
                      // compute area
                      Area4 = Area3 + pGate4->Area;
                      if ( pMan->tAreaMax > 0.0 && Area > pMan->tAreaMax )
                          break;
                      pSupers[4] = pGate4;   uTruths[4][0] = pGate4->uTruth[0];  uTruths[4][1] = pGate4->uTruth[1];  ptPinDelays[4] = pGate4->ptDelays;

                      Super_ManForEachGate( ppGatesLimit, nGatesLimit, i5, pGate5 )
                      if ( i5 != i0 && i5 != i1 && i5 != i2 && i5 != i3 && i5 != i4 )
                      {
                        if ( fTimeOut ) goto done;
                        fTimeOut = Super_CheckTimeout( pProgress, pMan );
                        // compute area
                        Area = Area4 + pGate5->Area;
                        if ( pMan->tAreaMax > 0.0 && Area > pMan->tAreaMax )
                            break;
                        pSupers[5] = pGate5;   uTruths[5][0] = pGate5->uTruth[0];  uTruths[5][1] = pGate5->uTruth[1];  ptPinDelays[5] = pGate5->ptDelays;

                        Mio_DeriveGateDelays( ppGates[k], ptPinDelays, nFanins, pMan->nVarsMax, SUPER_NO_VAR, tPinDelaysRes, &tPinDelayMax );
                        Mio_DeriveTruthTable( ppGates[k], uTruths, nFanins, pMan->nVarsMax, uTruth );
                        if ( !Super_CompareGates( pMan, uTruth, Area, tPinDelaysRes, pMan->nVarsMax ) )
                            continue;
                        // create a new gate
                        pGateNew = Super_CreateGateNew( pMan, ppGates[k], pSupers, nFanins, uTruth, Area, tPinDelaysRes, tPinDelayMax, pMan->nVarsMax );
                        Super_AddGateToTable( pMan, pGateNew );
                        if ( nGatesMax && pMan->nClasses > nGatesMax )
                            goto done;
                      }
                    }
                  }
                }
              }
            }
            break;
        default :
            assert( 0 );
            break;
        }
    }
done: 
    Extra_ProgressBarStop( pProgress );
    ABC_FREE( ppGatesLimit );
    return pMan;
}